

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_tiled_proc_grid(Integer g_a,Integer *dims,Integer *proc_grid)

{
  long lVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer jsize;
  Integer i;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  long local_28;
  long local_20;
  
  lVar1 = in_RDI + 1000;
  if (GA[lVar1].actv == 1) {
    pnga_error(in_stack_00000170,in_stack_00000168);
  }
  if (GA[lVar1].ndim < 1) {
    pnga_error(in_stack_00000170,in_stack_00000168);
  }
  if (GA[lVar1].distr_type != 0) {
    pnga_error(in_stack_00000170,in_stack_00000168);
  }
  GA[lVar1].distr_type = 3;
  for (local_20 = 0; local_20 < GA[lVar1].ndim; local_20 = local_20 + 1) {
    if (*(long *)(in_RSI + local_20 * 8) < 1) {
      pnga_error(in_stack_00000170,in_stack_00000168);
    }
    GA[lVar1].block_dims[local_20] = *(C_Integer *)(in_RSI + local_20 * 8);
    local_28 = GA[lVar1].dims[local_20] / *(long *)(in_RSI + local_20 * 8);
    if (GA[lVar1].dims[local_20] % *(long *)(in_RSI + local_20 * 8) != 0) {
      local_28 = local_28 + 1;
    }
    GA[lVar1].num_blocks[local_20] = local_28;
    if (*(long *)(in_RDX + local_20 * 8) < 1) {
      pnga_error(in_stack_00000170,in_stack_00000168);
    }
    GA[lVar1].nblock[local_20] = (int)*(undefined8 *)(in_RDX + local_20 * 8);
  }
  local_28 = 1;
  for (local_20 = 0; local_20 < GA[lVar1].ndim; local_20 = local_20 + 1) {
    local_28 = GA[lVar1].num_blocks[local_20] * local_28;
  }
  GA[lVar1].block_total = local_28;
  return;
}

Assistant:

void pnga_set_tiled_proc_grid(Integer g_a, Integer *dims, Integer *proc_grid)
{
  Integer i, jsize;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set tiled data distribution on array that has been allocated",0);
  if (!(GA[ga_handle].ndim > 0))
    pnga_error("Cannot set tiled data distribution if array size not set",0);
  if (GA[ga_handle].distr_type != REGULAR)
    pnga_error("Cannot reset tiled data distribution on array that has been set",0);
  GA[ga_handle].distr_type = TILED;
  /* evaluate number of blocks in each dimension */
  for (i=0; i<GA[ga_handle].ndim; i++) {
    if (dims[i] < 1)
      pnga_error("Block dimensions must all be greater than zero",0);
    GA[ga_handle].block_dims[i] = dims[i];
    jsize = GA[ga_handle].dims[i]/dims[i];
    if (GA[ga_handle].dims[i]%dims[i] != 0) jsize++;
    GA[ga_handle].num_blocks[i] = jsize;
    if (proc_grid[i] < 1)
      pnga_error("Processor grid dimensions must all be greater than zero",0);
    GA[ga_handle].nblock[i] = proc_grid[i];
  }
  jsize = 1;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    jsize *= GA[ga_handle].num_blocks[i];
  }
  GA[ga_handle].block_total = jsize;
}